

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_kneip::sPolynomial30
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[1];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x60] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x42] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x43] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x84] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x85] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[199] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x126] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x108] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x109] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x168] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1aa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x18c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x18d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x22e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x210] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x211] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x294] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x295] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x336] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x318] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x319] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x378] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x35a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x35b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3ba] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x39c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x39d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3fc] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3de] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3df] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x43e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x420] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x421] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x4c2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4a4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4a5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x504] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4e6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4e7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x546] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x528] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x529] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x588] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x56a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x56b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x5ca] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5ac] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5ad] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x60c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5ee] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5ef] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x690] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x672] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x673] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x6d2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6b4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6b5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x714] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6f6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6f7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x756] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x738] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x739] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x798] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x77a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x77b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x7da] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7bc] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7bd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8a0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x882] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x883] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8e2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8c4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8c5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa2c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa0e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa0f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa6e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa50] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa51] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xab0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa92] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa93] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xaf2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xad4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xad5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb34] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb16] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb17] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb76] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb58] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb59] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[3000] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb9a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb9b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xbfa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbdc] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbdd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc3c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc1e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc1f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc7e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc60] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc61] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xcc0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd02] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xce4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xce5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd44] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd26] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd27] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd86] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd68] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd69] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xdc8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdaa] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdab] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe0a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdec] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xded] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe4c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe2e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe2f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe8e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe70] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe71] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xed0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf12] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xef4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xef5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf54] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf36] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf37] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf96] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf78] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf79] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xfd8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfba] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfbb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x101a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xffc] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xffd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x109e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1080] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1081] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x10e0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1122] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1104] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1105] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1164] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1146] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1147] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11a6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1188] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1189] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11e8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11ca] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11cb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x122a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x120c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x120d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x126c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x124e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x124f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x12f0] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1332] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1314] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1315] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13b6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1398] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1399] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13f8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13da] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13db] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x143a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x141c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x141d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x147c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x145e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x145f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x14be] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1500] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1542] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1524] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1525] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1584] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1566] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1567] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x15c6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15a8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15a9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1608] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ea] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15eb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x164a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x162c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x162d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x168c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x166e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x166f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1710] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1794] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1776] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1777] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x17d6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17b8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17b9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x185a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x183c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x183d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1920] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1902] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1903] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1962] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1944] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1945] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19a4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1986] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1987] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19e6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19c8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19c9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1a28] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a0a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a0b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1aac] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a8e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a8f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1aee] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b30] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b12] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b13] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b72] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b54] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b55] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bb4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b96] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b97] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bf6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bd8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bd9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c38] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c1a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c1b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c7a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c5c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c5d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cbc] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c9e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c9f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cfe] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d40] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d22] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d23] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1dc4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1da6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1da7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e06] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1de8] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1de9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e8a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e6c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e6d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ecc] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eae] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eaf] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f0e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f50] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f32] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f33] / dVar2;
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[1];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f92] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f74] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f75] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fd4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fb6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fb7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2058] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x203a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x203b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x209a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x207c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x207d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x20dc] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20be] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20bf] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x211e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2100] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2101] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2160] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2142] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2143] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21a2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2184] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2185] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2268] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x224a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x224b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x22aa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x228c] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x228d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x232e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2310] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2311] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2370] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2352] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2353] / dVar2;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial30( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(30,1) = (groebnerMatrix(0,1)/(groebnerMatrix(0,0))-groebnerMatrix(1,1)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,2) = (groebnerMatrix(0,2)/(groebnerMatrix(0,0))-groebnerMatrix(1,2)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,3) = (groebnerMatrix(0,3)/(groebnerMatrix(0,0))-groebnerMatrix(1,3)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,4) = (groebnerMatrix(0,4)/(groebnerMatrix(0,0))-groebnerMatrix(1,4)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,5) = (groebnerMatrix(0,5)/(groebnerMatrix(0,0))-groebnerMatrix(1,5)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,6) = (groebnerMatrix(0,6)/(groebnerMatrix(0,0))-groebnerMatrix(1,6)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,8) = (groebnerMatrix(0,8)/(groebnerMatrix(0,0))-groebnerMatrix(1,8)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,10) = (groebnerMatrix(0,10)/(groebnerMatrix(0,0))-groebnerMatrix(1,10)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,11) = (groebnerMatrix(0,11)/(groebnerMatrix(0,0))-groebnerMatrix(1,11)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,12) = (groebnerMatrix(0,12)/(groebnerMatrix(0,0))-groebnerMatrix(1,12)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,13) = (groebnerMatrix(0,13)/(groebnerMatrix(0,0))-groebnerMatrix(1,13)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,14) = (groebnerMatrix(0,14)/(groebnerMatrix(0,0))-groebnerMatrix(1,14)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,15) = (groebnerMatrix(0,15)/(groebnerMatrix(0,0))-groebnerMatrix(1,15)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,16) = (groebnerMatrix(0,16)/(groebnerMatrix(0,0))-groebnerMatrix(1,16)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,18) = (groebnerMatrix(0,18)/(groebnerMatrix(0,0))-groebnerMatrix(1,18)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,19) = (groebnerMatrix(0,19)/(groebnerMatrix(0,0))-groebnerMatrix(1,19)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,20) = (groebnerMatrix(0,20)/(groebnerMatrix(0,0))-groebnerMatrix(1,20)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,21) = (groebnerMatrix(0,21)/(groebnerMatrix(0,0))-groebnerMatrix(1,21)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,22) = (groebnerMatrix(0,22)/(groebnerMatrix(0,0))-groebnerMatrix(1,22)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,23) = (groebnerMatrix(0,23)/(groebnerMatrix(0,0))-groebnerMatrix(1,23)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,25) = (groebnerMatrix(0,25)/(groebnerMatrix(0,0))-groebnerMatrix(1,25)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,26) = (groebnerMatrix(0,26)/(groebnerMatrix(0,0))-groebnerMatrix(1,26)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,27) = (groebnerMatrix(0,27)/(groebnerMatrix(0,0))-groebnerMatrix(1,27)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,28) = (groebnerMatrix(0,28)/(groebnerMatrix(0,0))-groebnerMatrix(1,28)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,29) = (groebnerMatrix(0,29)/(groebnerMatrix(0,0))-groebnerMatrix(1,29)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,30) = (groebnerMatrix(0,30)/(groebnerMatrix(0,0))-groebnerMatrix(1,30)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,33) = (groebnerMatrix(0,33)/(groebnerMatrix(0,0))-groebnerMatrix(1,33)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,34) = (groebnerMatrix(0,34)/(groebnerMatrix(0,0))-groebnerMatrix(1,34)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,39) = (groebnerMatrix(0,39)/(groebnerMatrix(0,0))-groebnerMatrix(1,39)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,40) = (groebnerMatrix(0,40)/(groebnerMatrix(0,0))-groebnerMatrix(1,40)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,41) = (groebnerMatrix(0,41)/(groebnerMatrix(0,0))-groebnerMatrix(1,41)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,42) = (groebnerMatrix(0,42)/(groebnerMatrix(0,0))-groebnerMatrix(1,42)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,43) = (groebnerMatrix(0,43)/(groebnerMatrix(0,0))-groebnerMatrix(1,43)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,44) = (groebnerMatrix(0,44)/(groebnerMatrix(0,0))-groebnerMatrix(1,44)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,45) = (groebnerMatrix(0,45)/(groebnerMatrix(0,0))-groebnerMatrix(1,45)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,46) = (groebnerMatrix(0,46)/(groebnerMatrix(0,0))-groebnerMatrix(1,46)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,47) = (groebnerMatrix(0,47)/(groebnerMatrix(0,0))-groebnerMatrix(1,47)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,48) = (groebnerMatrix(0,48)/(groebnerMatrix(0,0))-groebnerMatrix(1,48)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,49) = (groebnerMatrix(0,49)/(groebnerMatrix(0,0))-groebnerMatrix(1,49)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,50) = (groebnerMatrix(0,50)/(groebnerMatrix(0,0))-groebnerMatrix(1,50)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,51) = (groebnerMatrix(0,51)/(groebnerMatrix(0,0))-groebnerMatrix(1,51)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,52) = (groebnerMatrix(0,52)/(groebnerMatrix(0,0))-groebnerMatrix(1,52)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,53) = (groebnerMatrix(0,53)/(groebnerMatrix(0,0))-groebnerMatrix(1,53)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,54) = (groebnerMatrix(0,54)/(groebnerMatrix(0,0))-groebnerMatrix(1,54)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,55) = (groebnerMatrix(0,55)/(groebnerMatrix(0,0))-groebnerMatrix(1,55)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,56) = (groebnerMatrix(0,56)/(groebnerMatrix(0,0))-groebnerMatrix(1,56)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,57) = (groebnerMatrix(0,57)/(groebnerMatrix(0,0))-groebnerMatrix(1,57)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,58) = (groebnerMatrix(0,58)/(groebnerMatrix(0,0))-groebnerMatrix(1,58)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,59) = (groebnerMatrix(0,59)/(groebnerMatrix(0,0))-groebnerMatrix(1,59)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,60) = (groebnerMatrix(0,60)/(groebnerMatrix(0,0))-groebnerMatrix(1,60)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,61) = (groebnerMatrix(0,61)/(groebnerMatrix(0,0))-groebnerMatrix(1,61)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,62) = (groebnerMatrix(0,62)/(groebnerMatrix(0,0))-groebnerMatrix(1,62)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,64) = (groebnerMatrix(0,64)/(groebnerMatrix(0,0))-groebnerMatrix(1,64)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,65) = (groebnerMatrix(0,65)/(groebnerMatrix(0,0))-groebnerMatrix(1,65)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,66) = (groebnerMatrix(0,66)/(groebnerMatrix(0,0))-groebnerMatrix(1,66)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,67) = (groebnerMatrix(0,67)/(groebnerMatrix(0,0))-groebnerMatrix(1,67)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,68) = (groebnerMatrix(0,68)/(groebnerMatrix(0,0))-groebnerMatrix(1,68)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,69) = (groebnerMatrix(0,69)/(groebnerMatrix(0,0))-groebnerMatrix(1,69)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,70) = (groebnerMatrix(0,70)/(groebnerMatrix(0,0))-groebnerMatrix(1,70)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,71) = (groebnerMatrix(0,71)/(groebnerMatrix(0,0))-groebnerMatrix(1,71)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,73) = (groebnerMatrix(0,73)/(groebnerMatrix(0,0))-groebnerMatrix(1,73)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,74) = (groebnerMatrix(0,74)/(groebnerMatrix(0,0))-groebnerMatrix(1,74)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,76) = (groebnerMatrix(0,76)/(groebnerMatrix(0,0))-groebnerMatrix(1,76)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,77) = (groebnerMatrix(0,77)/(groebnerMatrix(0,0))-groebnerMatrix(1,77)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,78) = (groebnerMatrix(0,78)/(groebnerMatrix(0,0))-groebnerMatrix(1,78)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,79) = (groebnerMatrix(0,79)/(groebnerMatrix(0,0))-groebnerMatrix(1,79)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,80) = (groebnerMatrix(0,80)/(groebnerMatrix(0,0))-groebnerMatrix(1,80)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,81) = (groebnerMatrix(0,81)/(groebnerMatrix(0,0))-groebnerMatrix(1,81)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,82) = (groebnerMatrix(0,82)/(groebnerMatrix(0,0))-groebnerMatrix(1,82)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,83) = (groebnerMatrix(0,83)/(groebnerMatrix(0,0))-groebnerMatrix(1,83)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,84) = (groebnerMatrix(0,84)/(groebnerMatrix(0,0))-groebnerMatrix(1,84)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,85) = (groebnerMatrix(0,85)/(groebnerMatrix(0,0))-groebnerMatrix(1,85)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,86) = (groebnerMatrix(0,86)/(groebnerMatrix(0,0))-groebnerMatrix(1,86)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,87) = (groebnerMatrix(0,87)/(groebnerMatrix(0,0))-groebnerMatrix(1,87)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,89) = (groebnerMatrix(0,89)/(groebnerMatrix(0,0))-groebnerMatrix(1,89)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,91) = (groebnerMatrix(0,91)/(groebnerMatrix(0,0))-groebnerMatrix(1,91)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,92) = (groebnerMatrix(0,92)/(groebnerMatrix(0,0))-groebnerMatrix(1,92)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,94) = (groebnerMatrix(0,94)/(groebnerMatrix(0,0))-groebnerMatrix(1,94)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,97) = (groebnerMatrix(0,97)/(groebnerMatrix(0,0))-groebnerMatrix(1,97)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,98) = (groebnerMatrix(0,98)/(groebnerMatrix(0,0))-groebnerMatrix(1,98)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,99) = (groebnerMatrix(0,99)/(groebnerMatrix(0,0))-groebnerMatrix(1,99)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,100) = (groebnerMatrix(0,100)/(groebnerMatrix(0,0))-groebnerMatrix(1,100)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,101) = (groebnerMatrix(0,101)/(groebnerMatrix(0,0))-groebnerMatrix(1,101)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,103) = (groebnerMatrix(0,103)/(groebnerMatrix(0,0))-groebnerMatrix(1,103)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,104) = (groebnerMatrix(0,104)/(groebnerMatrix(0,0))-groebnerMatrix(1,104)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,105) = (groebnerMatrix(0,105)/(groebnerMatrix(0,0))-groebnerMatrix(1,105)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,106) = (groebnerMatrix(0,106)/(groebnerMatrix(0,0))-groebnerMatrix(1,106)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,107) = (groebnerMatrix(0,107)/(groebnerMatrix(0,0))-groebnerMatrix(1,107)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,108) = (groebnerMatrix(0,108)/(groebnerMatrix(0,0))-groebnerMatrix(1,108)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,109) = (groebnerMatrix(0,109)/(groebnerMatrix(0,0))-groebnerMatrix(1,109)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,110) = (groebnerMatrix(0,110)/(groebnerMatrix(0,0))-groebnerMatrix(1,110)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,111) = (groebnerMatrix(0,111)/(groebnerMatrix(0,0))-groebnerMatrix(1,111)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,112) = (groebnerMatrix(0,112)/(groebnerMatrix(0,0))-groebnerMatrix(1,112)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,113) = (groebnerMatrix(0,113)/(groebnerMatrix(0,0))-groebnerMatrix(1,113)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,115) = (groebnerMatrix(0,115)/(groebnerMatrix(0,0))-groebnerMatrix(1,115)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,116) = (groebnerMatrix(0,116)/(groebnerMatrix(0,0))-groebnerMatrix(1,116)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,118) = (groebnerMatrix(0,118)/(groebnerMatrix(0,0))-groebnerMatrix(1,118)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,119) = (groebnerMatrix(0,119)/(groebnerMatrix(0,0))-groebnerMatrix(1,119)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,120) = (groebnerMatrix(0,120)/(groebnerMatrix(0,0))-groebnerMatrix(1,120)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,121) = (groebnerMatrix(0,121)/(groebnerMatrix(0,0))-groebnerMatrix(1,121)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,122) = (groebnerMatrix(0,122)/(groebnerMatrix(0,0))-groebnerMatrix(1,122)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,123) = (groebnerMatrix(0,123)/(groebnerMatrix(0,0))-groebnerMatrix(1,123)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,125) = (groebnerMatrix(0,125)/(groebnerMatrix(0,0))-groebnerMatrix(1,125)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,126) = (groebnerMatrix(0,126)/(groebnerMatrix(0,0))-groebnerMatrix(1,126)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,127) = (groebnerMatrix(0,127)/(groebnerMatrix(0,0))-groebnerMatrix(1,127)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,128) = (groebnerMatrix(0,128)/(groebnerMatrix(0,0))-groebnerMatrix(1,128)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,129) = (groebnerMatrix(0,129)/(groebnerMatrix(0,0))-groebnerMatrix(1,129)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,130) = (groebnerMatrix(0,130)/(groebnerMatrix(0,0))-groebnerMatrix(1,130)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,133) = (groebnerMatrix(0,133)/(groebnerMatrix(0,0))-groebnerMatrix(1,133)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,134) = (groebnerMatrix(0,134)/(groebnerMatrix(0,0))-groebnerMatrix(1,134)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,136) = (groebnerMatrix(0,136)/(groebnerMatrix(0,0))-groebnerMatrix(1,136)/(groebnerMatrix(1,0)));
  groebnerMatrix(30,137) = (groebnerMatrix(0,137)/(groebnerMatrix(0,0))-groebnerMatrix(1,137)/(groebnerMatrix(1,0)));
}